

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::TopLevelASVkImpl::~TopLevelASVkImpl(TopLevelASVkImpl *this)

{
  void *in_RSI;
  TopLevelASVkImpl *this_local;
  
  ~TopLevelASVkImpl(this);
  RefCountedObject<Diligent::ITopLevelASVk>::operator_delete
            ((RefCountedObject<Diligent::ITopLevelASVk> *)this,in_RSI);
  return;
}

Assistant:

TopLevelASVkImpl::~TopLevelASVkImpl()
{
    // Vk object can only be destroyed when it is no longer used by the GPU
    if (m_VulkanTLAS != VK_NULL_HANDLE)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_VulkanTLAS), m_Desc.ImmediateContextMask);
    if (m_VulkanBuffer != VK_NULL_HANDLE)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_VulkanBuffer), m_Desc.ImmediateContextMask);
    if (m_MemoryAllocation.Page != nullptr)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_MemoryAllocation), m_Desc.ImmediateContextMask);
}